

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

void __thiscall TimerManager::~TimerManager(TimerManager *this)

{
  uint i;
  ulong uVar1;
  
  SmartPtr<Timer>::operator=(&this->mDefaultTimer,(Timer *)0x0);
  for (uVar1 = 0; uVar1 < (this->mTimers).mSize; uVar1 = uVar1 + 1) {
    jh_log_print(2,"TimerManager::~TimerManager()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/TimerManager.cpp"
                 ,0x51,"Possibly leaked Timer %p\n",(this->mTimers).mData[uVar1]);
  }
  Mutex::~Mutex(&this->mMutex);
  JetHead::vector<Timer_*>::~vector(&this->mTimers);
  SmartPtr<Timer>::~SmartPtr(&this->mDefaultTimer);
  return;
}

Assistant:

TimerManager::~TimerManager()
{
	TRACE_BEGIN(LOG_LVL_NOTICE);
	
	// Release reference to default timer
	mDefaultTimer = NULL;
	
	// At this point all outstanding timers should be
	// gone.  If we still have a timer in our list then
	// log a warning but do not do anything to the memory
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		LOG_WARN("Possibly leaked Timer %p\n", mTimers[i]);
	}
}